

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artist.h
# Opt level: O0

void __thiscall
artist::artist(artist *this,person *p,string *r,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *i)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *i_local;
  string *r_local;
  person *p_local;
  artist *this_local;
  
  person::person(&this->super_person,p);
  (this->super_person)._vptr_person = (_func_int **)&PTR__artist_00123d60;
  std::__cxx11::string::string((string *)&this->role);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->instruments);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->role,r);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->instruments,i);
  return;
}

Assistant:

artist( const person &p, const std::string &r, const std::vector < std::string > &i ) : person(p){
        role = r;
        instruments = i;
    }